

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O2

void __thiscall QUnsortedModelEngine::filterOnDemand(QUnsortedModelEngine *this,int n)

{
  QModelIndex *m;
  long lVar1;
  QString *pQVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  qsizetype qVar5;
  QString part;
  int iVar6;
  int iVar7;
  long *plVar8;
  int *piVar9;
  long in_FS_OFFSET;
  QIndexMapper local_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->super_QCompletionEngine).curMatch.partial == true) {
    plVar8 = (long *)QAbstractProxyModel::sourceModel();
    m = &(this->super_QCompletionEngine).curParent;
    iVar6 = (**(code **)(*plVar8 + 0x78))(plVar8,m);
    piVar9 = &(this->super_QCompletionEngine).curMatch.indices.t;
    if ((this->super_QCompletionEngine).curMatch.indices.v != false) {
      piVar9 = (this->super_QCompletionEngine).curMatch.indices.vector.d.ptr +
               (this->super_QCompletionEngine).curMatch.indices.vector.d.size + -1;
    }
    local_60.f = *piVar9 + 1;
    local_60.v = false;
    local_60._1_7_ = 0xaaaaaaaaaaaaaa;
    local_60.vector.d.size = 0;
    local_60.vector.d.d = (Data *)0x0;
    local_60.vector.d.ptr = (int *)0x0;
    local_60.t = iVar6 + -1;
    iVar7 = buildIndices(this,(this->super_QCompletionEngine).curParts.d.ptr +
                              (this->super_QCompletionEngine).curParts.d.size + -1,m,n,&local_60,
                         &(this->super_QCompletionEngine).curMatch);
    (this->super_QCompletionEngine).curMatch.partial = iVar6 + -1 != iVar7;
    lVar1 = (this->super_QCompletionEngine).curParts.d.size;
    pQVar2 = (this->super_QCompletionEngine).curParts.d.ptr;
    pDVar3 = pQVar2[lVar1 + -1].d.d;
    pcVar4 = pQVar2[lVar1 + -1].d.ptr;
    qVar5 = pQVar2[lVar1 + -1].d.size;
    if (pDVar3 != (Data *)0x0) {
      LOCK();
      (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    part.d.ptr = pcVar4;
    part.d.d = pDVar3;
    part.d.size = qVar5;
    QCompletionEngine::saveInCache
              (&this->super_QCompletionEngine,part,(QModelIndex *)&stack0xffffffffffffff88,
               (QMatchData *)m);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)&stack0xffffffffffffff88);
    QArrayDataPointer<int>::~QArrayDataPointer(&local_60.vector.d);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QUnsortedModelEngine::filterOnDemand(int n)
{
    Q_ASSERT(matchCount());
    if (!curMatch.partial)
        return;
    Q_ASSERT(n >= -1);
    const QAbstractItemModel *model = c->proxy->sourceModel();
    int lastRow = model->rowCount(curParent) - 1;
    QIndexMapper im(curMatch.indices.last() + 1, lastRow);
    int lastIndex = buildIndices(curParts.constLast(), curParent, n, im, &curMatch);
    curMatch.partial = (lastRow != lastIndex);
    saveInCache(curParts.constLast(), curParent, curMatch);
}